

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

ArenaBlock * __thiscall
google::protobuf::internal::ThreadSafeArena::FirstBlock
          (ThreadSafeArena *this,void *buf,size_t size,AllocationPolicy *policy)

{
  bool bVar1;
  ArenaBlock *pAVar2;
  string *psVar3;
  SizedPtr SVar4;
  uint local_34;
  ulong local_30 [2];
  
  SVar4.n = size;
  SVar4.p = buf;
  bVar1 = AllocationPolicy::IsDefault(policy);
  if (bVar1) {
    pAVar2 = FirstBlock(this,buf,size);
    return pAVar2;
  }
  local_30[0] = (ulong)((uint)buf & 7);
  local_34 = 0;
  psVar3 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_long,unsigned_int>
                     (local_30,&local_34,"reinterpret_cast<uintptr_t>(buf) & 7 == 0u");
  if (psVar3 == (string *)0x0) {
    if (size < 0x30 || buf == (void *)0x0) {
      SVar4 = anon_unknown_12::AllocateBlock(policy,0,0x20);
    }
    else {
      *(byte *)&(this->alloc_policy_).policy_ = (byte)(this->alloc_policy_).policy_ | 1;
    }
    ArenaBlock::ArenaBlock((ArenaBlock *)SVar4.p,(ArenaBlock *)0x0,SVar4.n);
    return (ArenaBlock *)SVar4.p;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/arena.cc"
             ,0x252,psVar3->_M_string_length,(psVar3->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_30);
}

Assistant:

ArenaBlock* ThreadSafeArena::FirstBlock(void* buf, size_t size,
                                        const AllocationPolicy& policy) {
  if (policy.IsDefault()) return FirstBlock(buf, size);

  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(buf) & 7, 0u);

  SizedPtr mem;
  if (buf == nullptr || size < kBlockHeaderSize + kAllocPolicySize) {
    mem = AllocateBlock(&policy, 0, kAllocPolicySize);
  } else {
    mem = {buf, size};
    // Record user-owned block.
    alloc_policy_.set_is_user_owned_initial_block(true);
  }

  return new (mem.p) ArenaBlock{nullptr, mem.n};
}